

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UResourceBundle *
ures_getByKeyWithFallback_63
          (UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  ResourceData *pResData;
  Resource r;
  uint table;
  int iVar1;
  UResourceBundle *pUVar2;
  size_t sVar3;
  char *pcVar4;
  UErrorCode UVar5;
  Resource r_00;
  UResourceDataEntry *realData;
  char *pcVar6;
  int local_cc;
  char *myPath;
  UResourceBundle *local_c0;
  char *local_b8;
  UResourceBundle *local_b0;
  UErrorCode errorCode;
  StringPiece local_a0;
  char *local_90;
  CharString path;
  int32_t t;
  StringPiece local_40;
  
  if (status == (UErrorCode *)0x0) {
    return fillIn;
  }
  if (U_ZERO_ERROR < *status) {
    return fillIn;
  }
  if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return fillIn;
  }
  table = resB->fRes;
  if ((table & 0xf0000000) == 0x20000000 || (table & 0xe0000000) == 0x40000000) {
    local_c0 = fillIn;
    local_b0 = resB;
    icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
    path.len = 0;
    *path.buffer.ptr = '\0';
    errorCode = U_ZERO_ERROR;
    local_b8 = inKey;
    icu_63::StringPiece::StringPiece(&local_a0,inKey);
    icu_63::CharString::append(&path,local_a0.ptr_,local_a0.length_,&errorCode);
    pUVar2 = local_b0;
    if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pResData = &local_b0->fResData;
      if (*path.buffer.ptr == '\0') {
        icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
LAB_002c6695:
        fillIn = init_resb_result(pResData,table,local_b8,-1,pUVar2->fData,pUVar2,0,local_c0,status)
        ;
        goto LAB_002c6519;
      }
      pcVar6 = path.buffer.ptr;
      do {
        if (((table & 0xf0000000) != 0x20000000) && ((table & 0xe0000000) != 0x40000000))
        goto LAB_002c6369;
        pcVar4 = strchr(pcVar6,0x2f);
        if (pcVar4 == (char *)0x0) {
          sVar3 = strlen(pcVar6);
          pcVar4 = pcVar6 + sVar3;
        }
        else {
          *pcVar4 = '\0';
          pcVar4 = pcVar4 + 1;
        }
        myPath = pcVar6;
        table = res_getTableItemByKey_63(pResData,table,&t,&myPath);
      } while ((*pcVar4 != '\0') && (pcVar6 = pcVar4, table != 0xffffffff));
      if (*pcVar4 != '\0') goto LAB_002c6369;
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
      local_a0.ptr_ = local_b8;
      pUVar2 = local_b0;
      if (table != 0xffffffff) goto LAB_002c6695;
    }
    else {
LAB_002c6369:
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
    }
    pUVar2 = local_b0;
    realData = local_b0->fData;
    local_a0.ptr_ = local_b8;
    icu_63::MaybeStackArray<char,_40>::MaybeStackArray(&path.buffer);
    path.len = 0;
    *path.buffer.ptr = '\0';
    myPath = (char *)0x0;
    local_90 = pUVar2->fResPath;
    local_cc = pUVar2->fResPathLen;
    pUVar2 = (UResourceBundle *)0x0;
    do {
      pcVar6 = local_b8;
      realData = realData->fParent;
      if (realData == (UResourceDataEntry *)0x0) {
        *status = U_MISSING_RESOURCE_ERROR;
        goto LAB_002c665a;
      }
      r = 0xffffffff;
      if (realData->fBogus == U_ZERO_ERROR) {
        r_00 = (realData->fData).rootRes;
        path.len = 0;
        *path.buffer.ptr = '\0';
        if (0 < local_cc) {
          icu_63::CharString::append(&path,local_90,local_cc,status);
        }
        icu_63::StringPiece::StringPiece(&local_40,pcVar6);
        icu_63::CharString::append(&path,local_40.ptr_,local_40.length_,status);
        if (U_ZERO_ERROR < *status) {
          ures_closeBundle(pUVar2,'\x01');
          icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
          return local_c0;
        }
        myPath = path.buffer.ptr;
        local_a0.ptr_ = pcVar6;
        do {
          r = res_findResource_63(&realData->fData,r_00,&myPath,&local_a0.ptr_);
          if ((r & 0xf0000000) == 0x30000000) {
            if (*myPath == '\0') goto LAB_002c65eb;
            pUVar2 = init_resb_result(&realData->fData,r,(char *)0x0,-1,realData,local_b0,0,pUVar2,
                                      status);
            if (pUVar2 == (UResourceBundle *)0x0) {
              pUVar2 = (UResourceBundle *)0x0;
              goto LAB_002c65eb;
            }
            realData = pUVar2->fData;
            local_90 = pUVar2->fResPath;
            r_00 = pUVar2->fRes;
            local_cc = pUVar2->fResPathLen;
          }
        } while (*myPath != '\0');
      }
    } while (r == 0xffffffff);
LAB_002c65eb:
    pcVar6 = realData->fName;
    pcVar4 = uloc_getDefault_63();
    iVar1 = strcmp(pcVar6,pcVar4);
    if (iVar1 == 0) {
      UVar5 = U_USING_DEFAULT_WARNING;
    }
    else {
      iVar1 = strcmp(realData->fName,"root");
      UVar5 = (uint)(iVar1 == 0) | U_ERROR_WARNING_START;
    }
    *status = UVar5;
    local_c0 = init_resb_result(&realData->fData,r,local_b8,-1,realData,local_b0,0,local_c0,status);
LAB_002c665a:
    icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&path.buffer);
    fillIn = local_c0;
  }
  else {
    *status = U_RESOURCE_TYPE_MISMATCH;
LAB_002c6519:
    pUVar2 = (UResourceBundle *)0x0;
  }
  ures_closeBundle(pUVar2,'\x01');
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 
ures_getByKeyWithFallback(const UResourceBundle *resB, 
                          const char* inKey, 
                          UResourceBundle *fillIn, 
                          UErrorCode *status) {
    Resource res = RES_BOGUS, rootRes = RES_BOGUS;
    /*UResourceDataEntry *realData = NULL;*/
    UResourceBundle *helper = NULL;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        res = getTableItemByKeyPath(&(resB->fResData), resB->fRes, inKey);
        const char* key = inKey;
        if(res == RES_BOGUS) {
            UResourceDataEntry *dataEntry = resB->fData;
            CharString path;
            char *myPath = NULL;
            const char* resPath = resB->fResPath;
            int32_t len = resB->fResPathLen;
            while(res == RES_BOGUS && dataEntry->fParent != NULL) { /* Otherwise, we'll look in parents */
                dataEntry = dataEntry->fParent;
                rootRes = dataEntry->fData.rootRes;

                if(dataEntry->fBogus == U_ZERO_ERROR) {
                    path.clear();
                    if (len > 0) {
                        path.append(resPath, len, *status);
                    }
                    path.append(inKey, *status);
                    if (U_FAILURE(*status)) {
                        ures_close(helper);
                        return fillIn;
                    }
                    myPath = path.data();
                    key = inKey;
                    do {
                        res = res_findResource(&(dataEntry->fData), rootRes, &myPath, &key);
                        if (RES_GET_TYPE(res) == URES_ALIAS && *myPath) {
                            /* We hit an alias, but we didn't finish following the path. */
                            helper = init_resb_result(&(dataEntry->fData), res, NULL, -1, dataEntry, resB, 0, helper, status); 
                            /*helper = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, helper, status);*/
                            if(helper) {
                              dataEntry = helper->fData;
                              rootRes = helper->fRes;
                              resPath = helper->fResPath;
                              len = helper->fResPathLen;

                            } else {
                              break;
                            }
                        }
                    } while(*myPath); /* Continue until the whole path is consumed */
                }
            }
            /*const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);*/
            if(res != RES_BOGUS) {
              /* check if resB->fResPath gives the right name here */
                if(uprv_strcmp(dataEntry->fName, uloc_getDefault())==0 || uprv_strcmp(dataEntry->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }

                fillIn = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, fillIn, status);
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            fillIn = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    ures_close(helper);
    return fillIn;
}